

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMMemoryCopyFillLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMMemoryCopyFillLowering::visitMemoryFill(LLVMMemoryCopyFillLowering *this,MemoryFill *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Module *wasm;
  Call *expression;
  PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
  *this_00;
  Type local_90 [3];
  allocator<wasm::Expression_*> local_71;
  Expression *local_70;
  pointer local_68;
  pointer local_60;
  iterator local_58;
  size_type local_50;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  string_view local_30;
  Builder local_20;
  Builder builder;
  MemoryFill *curr_local;
  LLVMMemoryCopyFillLowering *this_local;
  
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>_>
             ).
             super_PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
  ;
  builder.wasm = (Module *)curr;
  wasm = Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
         ::getModule(&this_00->
                      super_Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
                    );
  Builder::Builder(&local_20,wasm);
  wasm::Name::Name((Name *)&local_30,"__memory_fill");
  local_70 = (Expression *)
             ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68 = ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_60 = ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = &local_70;
  local_50 = 3;
  std::allocator<wasm::Expression_*>::allocator(&local_71);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_48,__l,&local_71);
  wasm::Type::Type(local_90,none);
  expression = Builder::makeCall(&local_20,(Name)local_30,&local_48,local_90[0],false);
  Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>::
  replaceCurrent(&this_00->
                  super_Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
                 ,(Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_48);
  std::allocator<wasm::Expression_*>::~allocator(&local_71);
  this->needsMemoryFill = true;
  return;
}

Assistant:

void visitMemoryFill(MemoryFill* curr) {
    Builder builder(*getModule());
    replaceCurrent(builder.makeCall(
      "__memory_fill", {curr->dest, curr->value, curr->size}, Type::none));
    needsMemoryFill = true;
  }